

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionMessageTest.cpp
# Opt level: O2

void __thiscall
AssertionMessageTest_formatInt_Test::AssertionMessageTest_formatInt_Test
          (AssertionMessageTest_formatInt_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001759b8;
  return;
}

Assistant:

TEST(AssertionMessageTest, formatInt)
{
    const std::string expectedMessage("32767 2147483647 9223372036854775807");

    std::int16_t int16Value = 32767;
    std::int32_t int32Value = 2147483647;
    std::int64_t int64Value = 9223372036854775807;

    cppassert::internal::AssertionMessage message;
    message<<int16Value<<" "<<int32Value<<" "<<int64Value;
    EXPECT_EQ(expectedMessage, message.str());
}